

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O3

void __thiscall QHttpThreadDelegate::QHttpThreadDelegate(QHttpThreadDelegate *this,QObject *parent)

{
  long in_FS_OFFSET;
  QUrl local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,parent);
  *(undefined ***)this = &PTR_metaObject_002cee20;
  this[0x10] = (QHttpThreadDelegate)0x0;
  *(undefined8 *)(this + 0x18) = 0;
  QUrl::QUrl(&local_30);
  QHttpNetworkRequest::QHttpNetworkRequest
            ((QHttpNetworkRequest *)(this + 0x20),&local_30,Get,NormalPriority);
  QUrl::~QUrl(&local_30);
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined1 (*) [16])(this + 0x50) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x40) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x30) = (undefined1  [16])0x0;
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)(this + 0x68));
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)(this + 0x70));
  this[0x88] = (QHttpThreadDelegate)0x0;
  *(undefined1 (*) [16])(this + 0x78) = (undefined1  [16])0x0;
  *(undefined8 *)(this + 0x90) = 0xffffffffffffffff;
  *(undefined1 (*) [16])(this + 0x98) = (undefined1  [16])0x0;
  *(undefined8 *)(this + 0xa8) = 0;
  QHttpHeaders::QHttpHeaders((QHttpHeaders *)(this + 0xb0));
  *(undefined4 *)(this + 0xb8) = 0;
  *(undefined1 (*) [16])(this + 0xc0) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0xcb) = (undefined1  [16])0x0;
  *(undefined4 *)(this + 0xe0) = 0xffffffff;
  *(undefined4 *)(this + 0xe4) = 0xffffffff;
  *(undefined4 *)(this + 0xe8) = 0xffffffff;
  *(undefined4 *)(this + 0xec) = 0xffffffff;
  *(undefined4 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  QHttp1Configuration::QHttp1Configuration((QHttp1Configuration *)(this + 0x110));
  QHttp2Configuration::QHttp2Configuration((QHttp2Configuration *)(this + 0x118));
  *(undefined1 (*) [16])(this + 0x150) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x140) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x130) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(this + 0x120) = (undefined1  [16])0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpThreadDelegate::QHttpThreadDelegate(QObject *parent) :
    QObject(parent)
    , ssl(false)
    , downloadBufferMaximumSize(0)
    , readBufferMaxSize(0)
    , bytesEmitted(0)
    , pendingDownloadData()
    , pendingDownloadProgress()
    , synchronous(false)
    , connectionCacheExpiryTimeoutSeconds(-1)
    , incomingStatusCode(0)
    , isPipeliningUsed(false)
    , isHttp2Used(false)
    , incomingContentLength(-1)
    , removedContentLength(-1)
    , incomingErrorCode(QNetworkReply::NoError)
    , downloadBuffer()
    , httpConnection(nullptr)
    , httpReply(nullptr)
    , synchronousRequestLoop(nullptr)
{
}